

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  uint uVar13;
  GetterHeatmap<unsigned_short> *pGVar14;
  TransformerLogLog *pTVar15;
  ImPlotPlot *pIVar16;
  ImDrawVert *pIVar17;
  ImDrawIdx *pIVar18;
  ImVec2 IVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ImVec2 IVar23;
  undefined1 auVar24 [16];
  ImPlotContext *pIVar25;
  ImPlotContext *pIVar26;
  bool bVar27;
  bool bVar28;
  ImDrawIdx IVar29;
  ImU32 IVar30;
  float fVar31;
  float fVar32;
  ImVec2 IVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  double dVar38;
  double dVar39;
  ImVec2 IVar40;
  undefined1 auVar41 [16];
  float fVar42;
  double dVar43;
  double dVar44;
  
  pGVar14 = this->Getter;
  dVar44 = (pGVar14->HalfSize).x;
  dVar38 = (double)(prim % pGVar14->Cols) * pGVar14->Width + pGVar14->XRef + dVar44;
  dVar43 = (pGVar14->HalfSize).y;
  dVar39 = ((double)(prim / pGVar14->Cols) * pGVar14->Height + dVar43) * pGVar14->YDir +
           pGVar14->YRef;
  fVar31 = (float)(((double)pGVar14->Values[prim] - pGVar14->ScaleMin) /
                  (pGVar14->ScaleMax - pGVar14->ScaleMin));
  fVar42 = 1.0;
  if (fVar31 <= 1.0) {
    fVar42 = fVar31;
  }
  IVar30 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar31 < 0.0) & (uint)fVar42));
  pIVar25 = GImPlot;
  pTVar15 = this->Transformer;
  dVar20 = log10((dVar38 - dVar44) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = pIVar25->CurrentPlot;
  dVar2 = pIVar25->LogDenX;
  dVar3 = (pIVar16->XAxis).Range.Min;
  dVar4 = (pIVar16->XAxis).Range.Max;
  dVar21 = log10((dVar39 - dVar43) / pIVar16->YAxis[pTVar15->YAxis].Range.Min);
  pIVar26 = GImPlot;
  iVar12 = pTVar15->YAxis;
  pIVar16 = pIVar25->CurrentPlot;
  dVar5 = pIVar25->My[iVar12];
  dVar6 = pIVar25->LogDenY[iVar12];
  pTVar15 = this->Transformer;
  dVar7 = pIVar16->YAxis[iVar12].Range.Min;
  dVar8 = pIVar16->YAxis[iVar12].Range.Max;
  fVar42 = pIVar25->PixelRange[iVar12].Min.x;
  fVar31 = pIVar25->PixelRange[iVar12].Min.y;
  dVar9 = (pIVar16->XAxis).Range.Min;
  dVar10 = pIVar25->Mx;
  dVar22 = log10((dVar38 + dVar44) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = pIVar26->CurrentPlot;
  dVar44 = pIVar26->LogDenX;
  dVar38 = (pIVar16->XAxis).Range.Min;
  dVar11 = (pIVar16->XAxis).Range.Max;
  dVar43 = log10((dVar39 + dVar43) / pIVar16->YAxis[pTVar15->YAxis].Range.Min);
  if (IVar30 < 0x1000000) {
    bVar28 = false;
  }
  else {
    auVar34._8_8_ = dVar21;
    auVar34._0_8_ = dVar22;
    auVar35._8_4_ = SUB84(dVar6,0);
    auVar35._0_8_ = dVar44;
    auVar35._12_4_ = (int)((ulong)dVar6 >> 0x20);
    auVar35 = divpd(auVar34,auVar35);
    iVar12 = pTVar15->YAxis;
    pIVar16 = pIVar26->CurrentPlot;
    dVar38 = pIVar26->Mx *
             (((double)(float)auVar35._0_8_ * (dVar11 - dVar38) + dVar38) -
             (pIVar16->XAxis).Range.Min) + (double)pIVar26->PixelRange[iVar12].Min.x;
    dVar39 = dVar5 * (((double)(float)auVar35._8_8_ * (dVar8 - dVar7) + dVar7) - dVar7) +
             (double)fVar31;
    auVar41._8_8_ = dVar43;
    auVar41._0_8_ = dVar20;
    auVar24._8_4_ = SUB84(pIVar26->LogDenY[iVar12],0);
    auVar24._0_8_ = dVar2;
    auVar24._12_4_ = (int)((ulong)pIVar26->LogDenY[iVar12] >> 0x20);
    auVar35 = divpd(auVar41,auVar24);
    fVar31 = (float)dVar38;
    fVar32 = (float)dVar39;
    dVar44 = pIVar16->YAxis[iVar12].Range.Min;
    dVar43 = dVar10 * (((double)(float)auVar35._0_8_ * (dVar4 - dVar3) + dVar3) - dVar9) +
             (double)fVar42;
    dVar44 = pIVar26->My[iVar12] *
             (((double)(float)auVar35._8_8_ * (pIVar16->YAxis[iVar12].Range.Max - dVar44) + dVar44)
             - dVar44) + (double)pIVar26->PixelRange[iVar12].Min.y;
    fVar36 = (float)dVar43;
    fVar37 = (float)dVar44;
    fVar42 = fVar32;
    if (fVar37 <= fVar32) {
      fVar42 = fVar37;
    }
    bVar27 = false;
    bVar28 = false;
    if ((fVar42 < (cull_rect->Max).y) &&
       (fVar42 = (float)(~-(uint)(fVar37 <= fVar32) & (uint)fVar37 |
                        (uint)fVar32 & -(uint)(fVar37 <= fVar32)), pfVar1 = &(cull_rect->Min).y,
       bVar28 = bVar27, *pfVar1 <= fVar42 && fVar42 != *pfVar1)) {
      fVar42 = fVar36;
      if (fVar31 <= fVar36) {
        fVar42 = fVar31;
      }
      if ((fVar42 < (cull_rect->Max).x) &&
         (fVar42 = (float)(~-(uint)(fVar31 <= fVar36) & (uint)fVar31 |
                          -(uint)(fVar31 <= fVar36) & (uint)fVar36),
         (cull_rect->Min).x <= fVar42 && fVar42 != (cull_rect->Min).x)) {
        IVar40.x = (float)dVar43;
        IVar40.y = (float)dVar39;
        IVar33.x = (float)dVar38;
        IVar33.y = (float)dVar44;
        DrawList->_VtxWritePtr->pos = IVar40;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17->col = IVar30;
        IVar23.y = fVar37;
        IVar23.x = fVar36;
        pIVar17[1].pos = IVar23;
        pIVar17[1].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[1].col = IVar30;
        pIVar17[2].pos = IVar33;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[2].col = IVar30;
        IVar19.y = fVar32;
        IVar19.x = fVar31;
        pIVar17[3].pos = IVar19;
        pIVar17[3].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[3].col = IVar30;
        DrawList->_VtxWritePtr = pIVar17 + 4;
        uVar13 = DrawList->_VtxCurrentIdx;
        pIVar18 = DrawList->_IdxWritePtr;
        IVar29 = (ImDrawIdx)uVar13;
        *pIVar18 = IVar29;
        pIVar18[1] = IVar29 + 1;
        pIVar18[2] = IVar29 + 3;
        pIVar18[3] = IVar29 + 1;
        pIVar18[4] = IVar29 + 2;
        pIVar18[5] = IVar29 + 3;
        DrawList->_IdxWritePtr = pIVar18 + 6;
        DrawList->_VtxCurrentIdx = uVar13 + 4;
        bVar28 = true;
      }
    }
  }
  return bVar28;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }